

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  curl_llist *pcVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  int in_EDX;
  Curl_multi *pCVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  curl_socket_t socks [5];
  int actions [5];
  int local_94;
  uint local_90;
  uint local_8c;
  Curl_multi *local_88;
  curl_hash *local_80;
  int local_74;
  curl_llist_element *local_70;
  curl_socket_t local_68 [8];
  uint local_48 [6];
  
  local_68[0] = -1;
  local_68[1] = 0xffffffff;
  local_68[2] = 0xffffffff;
  local_68[3] = 0xffffffff;
  local_68[4] = 0xffffffff;
  local_88 = multi;
  uVar4 = multi_getsock(data,local_68,in_EDX);
  local_80 = &multi->sockhash;
  local_70 = &data->sh_queue;
  uVar7 = 0;
  do {
    bVar3 = (byte)uVar7;
    uVar14 = 1 << (bVar3 + 0x10 & 0x1f);
    uVar16 = (uint)uVar7;
    if ((uVar4 >> (bVar3 & 0x1f) & 0x10001) == 0) break;
    uVar10 = 1 << (bVar3 & 0x1f);
    iVar2 = local_68[(int)uVar16];
    local_94 = iVar2;
    if (iVar2 == -1) {
      pcVar5 = (curl_llist *)0x0;
    }
    else {
      pcVar5 = (curl_llist *)Curl_hash_pick(local_80,&local_94,4);
    }
    bVar17 = (uVar10 & uVar4) != 0;
    uVar11 = bVar17 + 2;
    if ((uVar14 & uVar4) == 0) {
      uVar11 = (uint)bVar17;
    }
    local_48[(int)uVar16] = uVar11;
    if (pcVar5 == (curl_llist *)0x0) {
      local_74 = iVar2;
      if (iVar2 == -1) {
        pcVar5 = (curl_llist *)0x0;
        local_94 = iVar2;
      }
      else {
        local_94 = iVar2;
        pcVar5 = (curl_llist *)Curl_hash_pick(local_80,&local_94,4);
      }
      pCVar9 = local_88;
      if (pcVar5 == (curl_llist *)0x0) {
        local_90 = uVar11;
        local_8c = uVar10;
        pcVar5 = (curl_llist *)(*Curl_ccalloc)(1,0x40);
        if (pcVar5 != (curl_llist *)0x0) {
          Curl_llist_init(pcVar5,(curl_llist_dtor)0x0);
          pvVar6 = Curl_hash_add(local_80,&local_74,4,pcVar5);
          uVar10 = local_8c;
          uVar11 = local_90;
          if (pvVar6 != (void *)0x0) goto LAB_0012a515;
          (*Curl_cfree)(pcVar5);
        }
        pcVar5 = (curl_llist *)0x0;
        uVar10 = local_8c;
        uVar11 = local_90;
      }
LAB_0012a515:
      if (pcVar5 != (curl_llist *)0x0) goto LAB_0012a520;
      iVar8 = 1;
      uVar14 = uVar16;
    }
    else {
      uVar7 = (ulong)(uint)data->numsocks;
      pCVar9 = local_88;
      if (data->numsocks < 1) {
        uVar16 = 0;
        uVar12 = 0;
        bVar17 = false;
      }
      else {
        uVar12 = 0;
        do {
          if (iVar2 == data->sockets[uVar12]) {
            uVar16 = data->actions[uVar12];
            bVar17 = true;
            goto LAB_0012a522;
          }
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
LAB_0012a520:
        uVar16 = 0;
        bVar17 = false;
        uVar12 = uVar7;
      }
LAB_0012a522:
      if ((bVar17) && (uVar16 != uVar11)) {
        if ((uVar16 & 1) != 0) {
          piVar1 = (int *)((long)&pcVar5[1].dtor + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((uVar16 & 2) != 0) {
          *(int *)&pcVar5[1].size = (int)pcVar5[1].size + -1;
        }
        if ((uVar10 & uVar4) != 0) {
          piVar1 = (int *)((long)&pcVar5[1].dtor + 4);
          *piVar1 = *piVar1 + 1;
        }
        if ((uVar14 & uVar4) != 0) {
          *(int *)&pcVar5[1].size = (int)pcVar5[1].size + 1;
        }
      }
      else if (!bVar17) {
        *(int *)&pcVar5[1].dtor = *(int *)&pcVar5[1].dtor + 1;
        if ((uVar10 & uVar4) != 0) {
          piVar1 = (int *)((long)&pcVar5[1].dtor + 4);
          *piVar1 = *piVar1 + 1;
        }
        if ((uVar14 & uVar4) != 0) {
          *(int *)&pcVar5[1].size = (int)pcVar5[1].size + 1;
        }
        Curl_llist_insert_next(pcVar5,pcVar5->tail,data,local_70);
      }
      iVar15 = (uint)(*(int *)((long)&pcVar5[1].dtor + 4) != 0) +
               (uint)((int)pcVar5[1].size != 0) * 2;
      iVar8 = 7;
      uVar14 = (uint)uVar12;
      if (*(int *)&pcVar5[1].head != iVar15) {
        if (pCVar9->socket_cb != (curl_socket_callback)0x0) {
          (*pCVar9->socket_cb)(data,iVar2,iVar15,pCVar9->socket_userp,pcVar5[1].tail);
        }
        *(int *)&pcVar5[1].head = iVar15;
        iVar8 = 0;
      }
    }
    if ((iVar8 != 7) && (iVar8 != 0)) {
      return CURLM_OUT_OF_MEMORY;
    }
    uVar16 = uVar14 + 1;
    uVar7 = (ulong)uVar16;
  } while ((int)uVar14 < 4);
  if (0 < data->numsocks) {
    lVar13 = 0;
    do {
      iVar2 = data->sockets[lVar13];
      if (0 < (int)uVar16) {
        uVar7 = 0;
        do {
          if (iVar2 == local_68[uVar7]) goto LAB_0012a6bb;
          uVar7 = uVar7 + 1;
        } while (uVar16 != uVar7);
      }
      local_94 = iVar2;
      if (iVar2 == -1) {
        pcVar5 = (curl_llist *)0x0;
      }
      else {
        pcVar5 = (curl_llist *)Curl_hash_pick(local_80,&local_94,4);
      }
      if (pcVar5 != (curl_llist *)0x0) {
        uVar4 = data->actions[lVar13];
        iVar8 = *(int *)&pcVar5[1].dtor + -1;
        *(int *)&pcVar5[1].dtor = iVar8;
        if ((uVar4 & 2) != 0) {
          *(int *)&pcVar5[1].size = (int)pcVar5[1].size + -1;
        }
        if ((uVar4 & 1) != 0) {
          piVar1 = (int *)((long)&pcVar5[1].dtor + 4);
          *piVar1 = *piVar1 + -1;
        }
        if (iVar8 == 0) {
          if (local_88->socket_cb != (curl_socket_callback)0x0) {
            (*local_88->socket_cb)(data,iVar2,4,local_88->socket_userp,pcVar5[1].tail);
          }
          local_94 = iVar2;
          Curl_hash_delete(local_80,&local_94,4);
        }
        else {
          Curl_llist_remove(pcVar5,local_70,(void *)0x0);
        }
      }
LAB_0012a6bb:
      lVar13 = lVar13 + 1;
    } while (lVar13 < data->numsocks);
  }
  memcpy(data->sockets,local_68,(long)(int)uVar16 << 2);
  memcpy(data->actions,local_48,(long)(int)uVar16 << 2);
  data->numsocks = uVar16;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      for(i = 0; i< data->numsocks; i++) {
        if(s == data->sockets[i]) {
          prevaction = data->actions[i];
          sincebefore = TRUE;
          break;
        }
      }

    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the list of handles using this socket! */
      Curl_llist_insert_next(&entry->list, entry->list.tail,
                             data, &data->sh_queue);
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

#if 0
    infof(data, "--- Comboaction: %u readers %u writers\n",
          entry->readers, entry->writers);
#endif
    /* check if it has the same action set */
    if(entry->action == comboaction)
      /* same, continue */
      continue;

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       comboaction,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
      else {
        /* remove this transfer as a user of this socket */
        Curl_llist_remove(&entry->list, &data->sh_queue, NULL);
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}